

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmd5stream.cpp
# Opt level: O0

int __thiscall TPZMD5Stream::CheckMD5(TPZMD5Stream *this,FILE *fh)

{
  ostream *this_00;
  
  this_00 = std::operator<<((ostream *)&std::cerr,
                            "Enable -DUSING_OPENSSL to use the TPZMD5Stream class.");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return 1;
}

Assistant:

int TPZMD5Stream::CheckMD5(FILE *fh) {
#ifdef USING_OPENSSL
  unsigned char this_digest[MD5_DIGEST_LENGTH];
  unsigned char file_digest[MD5_DIGEST_LENGTH];

  if (last_status != 1)
    return -3;

  /* Read file digest. */
  size_t ret = fread(file_digest, sizeof(unsigned char), MD5_DIGEST_LENGTH, fh);
  if (ret != MD5_DIGEST_LENGTH) {
    std::cerr << "fread could not read " << MD5_DIGEST_LENGTH << " items. Read only " << ret << " bytes." << std::endl;
    // Error.
    return 2;
  }

  /* Compute this digest. */
  if (MD5_Final(this_digest, md5_sig.operator->()) != 1) {
    // Error.
    return -1;
  }

  return compare_digests(this_digest, file_digest, MD5_DIGEST_LENGTH);
#else
  std::cerr << "Enable -DUSING_OPENSSL to use the TPZMD5Stream class." << std::endl;
  return 1;
#endif
}